

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

int __thiscall QDir::rmdir(QDir *this,char *__path)

{
  QDirPrivate *pQVar1;
  _Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_> _Var2;
  int iVar3;
  long in_FS_OFFSET;
  QString local_68;
  QFileSystemEntry local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(__path + 0x10) == 0) {
    rmdir();
    iVar3 = 0;
  }
  else {
    pQVar1 = (this->d_ptr).d.ptr;
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    filePath(&local_68,this,(QString *)__path);
    _Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl =
         (pQVar1->fileEngine)._M_t.
         super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
         super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
         super__Head_base<0UL,_QAbstractFileEngine_*,_false>;
    if (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl ==
        (QAbstractFileEngine *)0x0) {
      QFileSystemEntry::QFileSystemEntry(&local_48,&local_68);
      iVar3 = QFileSystemEngine::rmdir((char *)&local_48);
      if (&(local_48.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_48.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_48.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_48.m_filePath.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      iVar3 = (**(code **)(*(long *)_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>.
                                    _M_head_impl + 0x80))
                        (_Var2.super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,
                         &local_68,0);
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rmdir(const QString &dirName) const
{
    Q_D(const QDir);

    if (dirName.isEmpty()) {
        qWarning("QDir::rmdir: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirName);
    if (!d->fileEngine)
        return QFileSystemEngine::rmdir(QFileSystemEntry(fn));

    return d->fileEngine->rmdir(fn, false);
}